

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

BuiltinFunction * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::BuiltinFunction,jsonnet::internal::LocationRange_const&,std::__cxx11::string,std::vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>&>
          (Allocator *this,LocationRange *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *args_2)

{
  BuiltinFunction *this_00;
  Identifiers *in_RDX;
  string *in_RSI;
  LocationRange *in_RDI;
  BuiltinFunction *unaff_retaddr;
  BuiltinFunction *r;
  
  this_00 = (BuiltinFunction *)operator_new(0xb8);
  BuiltinFunction::BuiltinFunction(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }